

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall
leveldb::AddBoundaryInputsTest_TestDisjoinFilePointers_Test::
AddBoundaryInputsTest_TestDisjoinFilePointers_Test
          (AddBoundaryInputsTest_TestDisjoinFilePointers_Test *this)

{
  AddBoundaryInputsTest_TestDisjoinFilePointers_Test *this_local;
  
  AddBoundaryInputsTest::AddBoundaryInputsTest(&this->super_AddBoundaryInputsTest);
  (this->super_AddBoundaryInputsTest).super_Test._vptr_Test =
       (_func_int **)&PTR__AddBoundaryInputsTest_TestDisjoinFilePointers_Test_001bb3b0;
  return;
}

Assistant:

TEST_F(AddBoundaryInputsTest, TestDisjoinFilePointers) {
  FileMetaData* f1 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f2 =
      CreateFileMetaData(1, InternalKey("100", 6, kTypeValue),
                         InternalKey(InternalKey("100", 5, kTypeValue)));
  FileMetaData* f3 =
      CreateFileMetaData(1, InternalKey("100", 2, kTypeValue),
                         InternalKey(InternalKey("300", 1, kTypeValue)));
  FileMetaData* f4 =
      CreateFileMetaData(1, InternalKey("100", 4, kTypeValue),
                         InternalKey(InternalKey("100", 3, kTypeValue)));

  level_files_.push_back(f2);
  level_files_.push_back(f3);
  level_files_.push_back(f4);

  compaction_files_.push_back(f1);

  AddBoundaryInputs(icmp_, level_files_, &compaction_files_);
  ASSERT_EQ(3, compaction_files_.size());
  ASSERT_EQ(f1, compaction_files_[0]);
  ASSERT_EQ(f4, compaction_files_[1]);
  ASSERT_EQ(f3, compaction_files_[2]);
}